

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O2

ValueType_t RegistryValue::typestr_to_valuetype(string *typestr)

{
  bool bVar1;
  ulong uVar2;
  string *__return_storage_ptr__;
  ValueType_t VVar3;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> bStack_38;
  
  bVar1 = std::operator==(typestr,"none");
  VVar3 = 0;
  if (!bVar1) {
    bVar1 = std::operator==(typestr,"sz");
    VVar3 = 1;
    if ((!bVar1) && (bVar1 = std::operator==(typestr,"string"), !bVar1)) {
      bVar1 = std::operator==(typestr,"expand_sz");
      VVar3 = 2;
      if ((!bVar1) &&
         ((bVar1 = std::operator==(typestr,"expandsz"), !bVar1 &&
          (bVar1 = std::operator==(typestr,"expand"), !bVar1)))) {
        bVar1 = std::operator==(typestr,"binary");
        VVar3 = 3;
        if ((!bVar1) && (bVar1 = std::operator==(typestr,"hex"), !bVar1)) {
          bVar1 = std::operator==(typestr,"dword");
          VVar3 = 4;
          if ((!bVar1) && (bVar1 = std::operator==(typestr,"dwordle"), !bVar1)) {
            bVar1 = std::operator==(typestr,"qword");
            VVar3 = 0xb;
            if ((!bVar1) &&
               ((bVar1 = std::operator==(typestr,"qwordle"), !bVar1 &&
                (bVar1 = std::operator==(typestr,"qword"), !bVar1)))) {
              bVar1 = std::operator==(typestr,"dwordbe");
              if (bVar1) {
                VVar3 = 5;
              }
              else {
                bVar1 = std::operator==(typestr,"multisz");
                VVar3 = 7;
                if ((!bVar1) && (bVar1 = std::operator==(typestr,"multi_sz"), !bVar1)) {
                  bVar1 = std::operator==(typestr,"mui_sz");
                  if (bVar1) {
                    VVar3 = 0x15;
                  }
                  else {
                    bVar1 = std::operator==(typestr,"link");
                    if (bVar1) {
                      VVar3 = 6;
                    }
                    else {
                      bVar1 = std::operator==(typestr,"resourcelist");
                      VVar3 = 8;
                      if (((!bVar1) && (bVar1 = std::operator==(typestr,"resource_list"), !bVar1))
                         && (bVar1 = std::operator==(typestr,"rl"), !bVar1)) {
                        bVar1 = std::operator==(typestr,"full_resource_descriptor");
                        VVar3 = 9;
                        if ((!bVar1) && (bVar1 = std::operator==(typestr,"frd"), !bVar1)) {
                          bVar1 = std::operator==(typestr,"resource_requirements_list");
                          VVar3 = 10;
                          if ((!bVar1) && (bVar1 = std::operator==(typestr,"rrl"), !bVar1)) {
                            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                            basic_regex(&bStack_38,"^\\s*[0-9]+\\s*$",0x10);
                            bVar1 = std::
                                    regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                              (typestr,&bStack_38,0);
                            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                            ~basic_regex(&bStack_38);
                            if (!bVar1) {
                              __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
                              stringformat_abi_cxx11_
                                        (__return_storage_ptr__,"unknown value type: %hs",
                                         (typestr->_M_dataplus)._M_p);
                              __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                                          std::__cxx11::string::~string);
                            }
                            uVar2 = strtoul((typestr->_M_dataplus)._M_p,(char **)0x0,0);
                            VVar3 = (ValueType_t)uVar2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar3;
}

Assistant:

static ValueType_t typestr_to_valuetype(const std::string& typestr)
    {
        if (typestr=="none")                       return REG_NONE;
        if (typestr=="sz")                         return REG_SZ;
        if (typestr=="string")                     return REG_SZ;
        if (typestr=="expand_sz")                  return REG_EXPAND_SZ;
        if (typestr=="expandsz")                   return REG_EXPAND_SZ;
        if (typestr=="expand")                     return REG_EXPAND_SZ;
        if (typestr=="binary")                     return REG_BINARY;
        if (typestr=="hex")                        return REG_BINARY;
        if (typestr=="dword")                      return REG_DWORD;
        if (typestr=="dwordle")                    return REG_DWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="qwordle")                    return REG_QWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="dwordbe")                    return REG_DWORD_BIG_ENDIAN;
        if (typestr=="multisz")                    return REG_MULTI_SZ;
        if (typestr=="multi_sz")                   return REG_MULTI_SZ;
        if (typestr=="mui_sz")                     return REG_MUI_SZ;
        if (typestr=="link")                       return REG_LINK;
        if (typestr=="resourcelist")               return REG_RESOURCE_LIST;
        if (typestr=="resource_list")              return REG_RESOURCE_LIST;
        if (typestr=="rl")                         return REG_RESOURCE_LIST;
        if (typestr=="full_resource_descriptor")   return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="frd")                        return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="resource_requirements_list") return REG_RESOURCE_REQUIREMENTS_LIST;
        if (typestr=="rrl")                        return REG_RESOURCE_REQUIREMENTS_LIST;

        if (REGEX_MATCH(typestr, CHARREGEX("^\\s*[0-9]+\\s*$")))
            return strtoul(typestr.c_str(), 0, 0);

        throw stringformat("unknown value type: %hs", typestr.c_str());

    }